

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compositecodec.h
# Opt level: O0

void __thiscall
FastPForLib::CompositeCodec<FastPForLib::PFor2008,_FastPForLib::VariableByte>::~CompositeCodec
          (CompositeCodec<FastPForLib::PFor2008,_FastPForLib::VariableByte> *this)

{
  PFor2008 *in_RDI;
  
  (in_RDI->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00478fc8;
  VariableByte::~VariableByte((VariableByte *)0x14bb6a);
  PFor2008::~PFor2008(in_RDI);
  IntegerCODEC::~IntegerCODEC(&in_RDI->super_IntegerCODEC);
  return;
}

Assistant:

CompositeCodec() : codec1(), codec2() {}